

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

bool __thiscall QGraphicsScene::sendEvent(QGraphicsScene *this,QGraphicsItem *item,QEvent *event)

{
  QGraphicsScenePrivate *this_00;
  bool bVar1;
  QGraphicsScene *pQVar2;
  QGraphicsScene *pQVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (item == (QGraphicsItem *)0x0) {
    sendEvent();
  }
  else {
    this_00 = *(QGraphicsScenePrivate **)(this + 8);
    pQVar2 = (QGraphicsScene *)QGraphicsItem::scene(item);
    if (pQVar2 == this) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        bVar1 = QGraphicsScenePrivate::sendEvent(this_00,item,event);
        return bVar1;
      }
      goto LAB_0060f351;
    }
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_30 = "default";
    pQVar3 = QGraphicsItem::scene(item);
    QMessageLogger::warning
              (local_48,
               "QGraphicsScene::sendEvent: item %p\'s scene (%p) is different from this scene (%p)",
               item,pQVar3,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return false;
  }
LAB_0060f351:
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScene::sendEvent(QGraphicsItem *item, QEvent *event)
{
    Q_D(QGraphicsScene);
    if (!item) {
        qWarning("QGraphicsScene::sendEvent: cannot send event to a null item");
        return false;
    }
    if (item->scene() != this) {
        qWarning("QGraphicsScene::sendEvent: item %p's scene (%p)"
                 " is different from this scene (%p)",
                 item, item->scene(), this);
        return false;
    }
    return d->sendEvent(item, event);
}